

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall
llm_build_codeshell::llm_build_codeshell
          (llm_build_codeshell *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  llama_hparams *plVar2;
  pointer plVar3;
  ggml_context *pgVar4;
  uint32_t uVar5;
  ggml_tensor *pgVar6;
  llm_graph_input_attn_kv_unified *inp;
  ulong uVar7;
  ggml_tensor *pgVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ggml_tensor *cur;
  ggml_tensor *cur_00;
  ggml_tensor *cur_01;
  ggml_tensor *pgVar12;
  char *pcVar13;
  int il;
  long lVar14;
  long lVar15;
  float __x;
  float fVar16;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar17;
  ggml_tensor *local_70;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  plVar2 = (this->super_llm_graph_context).hparams;
  uVar1 = plVar2->n_embd_head_v;
  uVar5 = llama_hparams::n_embd_v_gqa(plVar2,0);
  plVar2 = (this->super_llm_graph_context).hparams;
  if (uVar1 == plVar2->n_embd_head_k) {
    if (uVar1 == plVar2->n_rot) {
      local_70 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
      pgVar6 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
      inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
      if (0 < (this->super_llm_graph_context).n_layer) {
        uVar7 = (ulong)uVar5;
        __x = (float)uVar1;
        lVar15 = 0;
        lVar14 = 0;
        do {
          uVar17 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
          plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          il = (int)lVar14;
          pgVar8 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,local_70,
                              *(ggml_tensor **)((long)&plVar3->attn_norm + lVar15),
                              *(ggml_tensor **)((long)&plVar3->attn_norm_b + lVar15),LLM_NORM,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"attn_norm",il);
          pgVar8 = llm_graph_context::build_lora_mm
                             (&this->super_llm_graph_context,
                              *(ggml_tensor **)
                               ((long)&((model->layers).
                                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->wqkv + lVar15),
                              pgVar8);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"wqkv",il);
          pgVar8 = (ggml_tensor *)
                   ggml_add((this->super_llm_graph_context).ctx0,pgVar8,
                            *(undefined8 *)
                             ((long)&((model->layers).
                                      super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->bqkv + lVar15));
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"bqkv",il);
          pgVar4 = (this->super_llm_graph_context).ctx0;
          uVar9 = ggml_view_2d(pgVar4,pgVar8,(this->super_llm_graph_context).n_embd,
                               (long)(this->super_llm_graph_context).n_tokens,pgVar8->nb[1],0);
          uVar9 = ggml_cont(pgVar4,uVar9);
          pgVar4 = (this->super_llm_graph_context).ctx0;
          uVar10 = ggml_view_2d(pgVar4,pgVar8,uVar7,(long)(this->super_llm_graph_context).n_tokens,
                                pgVar8->nb[1],(this->super_llm_graph_context).n_embd << 2);
          uVar10 = ggml_cont(pgVar4,uVar10);
          pgVar4 = (this->super_llm_graph_context).ctx0;
          uVar11 = ggml_view_2d(pgVar4,pgVar8,uVar7,(long)(this->super_llm_graph_context).n_tokens,
                                pgVar8->nb[1],((this->super_llm_graph_context).n_embd + uVar7) * 4);
          uVar11 = ggml_cont(pgVar4,uVar11);
          uVar9 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar9,uVar1,
                                  (this->super_llm_graph_context).n_head,
                                  (long)(this->super_llm_graph_context).n_tokens);
          uVar10 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar10,uVar1,
                                   (this->super_llm_graph_context).n_head_kv,
                                   (long)(this->super_llm_graph_context).n_tokens);
          cur = (ggml_tensor *)
                ggml_reshape_3d((this->super_llm_graph_context).ctx0,uVar11,uVar1,
                                (this->super_llm_graph_context).n_head_kv,
                                (long)(this->super_llm_graph_context).n_tokens);
          cur_00 = (ggml_tensor *)
                   ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                 (this->super_llm_graph_context).freq_scale,
                                 (this->super_llm_graph_context).ext_factor,
                                 (this->super_llm_graph_context).attn_factor,
                                 (this->super_llm_graph_context).beta_fast,
                                 (this->super_llm_graph_context).beta_slow,
                                 (this->super_llm_graph_context).ctx0,uVar9,pgVar6,0,
                                 (int)(this->super_llm_graph_context).n_rot,
                                 (this->super_llm_graph_context).rope_type,
                                 CONCAT44(uVar17,(this->super_llm_graph_context).n_ctx_orig));
          cur_01 = (ggml_tensor *)
                   ggml_rope_ext((this->super_llm_graph_context).freq_base,
                                 (this->super_llm_graph_context).freq_scale,
                                 (this->super_llm_graph_context).ext_factor,
                                 (this->super_llm_graph_context).attn_factor,
                                 (this->super_llm_graph_context).beta_fast,
                                 (this->super_llm_graph_context).beta_slow,
                                 (this->super_llm_graph_context).ctx0,uVar10,pgVar6,0,
                                 (int)(this->super_llm_graph_context).n_rot,
                                 (this->super_llm_graph_context).rope_type,
                                 (this->super_llm_graph_context).n_ctx_orig);
          llm_graph_context::cb(&this->super_llm_graph_context,cur_00,"Qcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,cur_01,"Kcur",il);
          llm_graph_context::cb(&this->super_llm_graph_context,cur,"Vcur",il);
          plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pgVar8 = *(ggml_tensor **)((long)&plVar3->wo + lVar15);
          pgVar12 = *(ggml_tensor **)((long)&plVar3->bo + lVar15);
          fVar16 = SQRT(__x);
          if (__x < 0.0) {
            fVar16 = sqrtf(__x);
          }
          pgVar8 = llm_graph_context::build_attn
                             (&this->super_llm_graph_context,inp,gf,pgVar8,pgVar12,cur_00,cur_01,cur
                              ,(ggml_tensor *)0x0,(ggml_tensor *)0x0,1.0 / fVar16,il);
          if (lVar14 == (this->super_llm_graph_context).n_layer + -1) {
            pgVar12 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
            pgVar8 = (ggml_tensor *)
                     ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar8,pgVar12);
            local_70 = (ggml_tensor *)
                       ggml_get_rows((this->super_llm_graph_context).ctx0,local_70,pgVar12);
          }
          pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar8,local_70);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar8,"ffn_inp",il);
          plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pgVar12 = llm_graph_context::build_norm
                              (&this->super_llm_graph_context,pgVar8,
                               *(ggml_tensor **)((long)&plVar3->ffn_norm + lVar15),
                               *(ggml_tensor **)((long)&plVar3->ffn_norm_b + lVar15),LLM_NORM,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"ffn_norm",il);
          plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          in_stack_ffffffffffffff28 = 0;
          pgVar12 = llm_graph_context::build_ffn
                              (&this->super_llm_graph_context,pgVar12,
                               *(ggml_tensor **)((long)&plVar3->ffn_up + lVar15),
                               *(ggml_tensor **)((long)&plVar3->ffn_up_b + lVar15),
                               (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                               (ggml_tensor *)0x0,
                               *(ggml_tensor **)((long)&plVar3->ffn_down + lVar15),
                               *(ggml_tensor **)((long)&plVar3->ffn_down_b + lVar15),
                               (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_GELU,LLM_FFN_SEQ,il);
          llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"ffn_out",il);
          pgVar8 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar12,pgVar8);
          local_70 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar8,il);
          llm_graph_context::cb(&this->super_llm_graph_context,local_70,"l_out",il);
          lVar14 = lVar14 + 1;
          lVar15 = lVar15 + 0x4f0;
        } while (lVar14 < (this->super_llm_graph_context).n_layer);
      }
      pgVar6 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,local_70,model->output_norm,
                          model->output_norm_b,LLM_NORM,-1);
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"result_norm",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar6;
      pgVar6 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar6)
      ;
      llm_graph_context::cb(&this->super_llm_graph_context,pgVar6,"result_output",-1);
      ((this->super_llm_graph_context).res._M_t.
       super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
       super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
       super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar6;
      ggml_build_forward_expand(gf,pgVar6);
      return;
    }
    pcVar13 = "n_embd_head == hparams.n_rot";
    uVar9 = 0x1d4f;
  }
  else {
    pcVar13 = "n_embd_head == hparams.n_embd_head_k";
    uVar9 = 0x1d4e;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,uVar9,"GGML_ASSERT(%s) failed",pcVar13);
}

Assistant:

llm_build_codeshell(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    model.layers[il].attn_norm_b,
                    LLM_NORM, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                cur = build_lora_mm(model.layers[il].wqkv, cur);
                cb(cur, "wqkv", il);

                cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                cb(cur, "bqkv", il);

                ggml_tensor * Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                ggml_tensor * Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                ggml_tensor * Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            // add the input
            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            // FF
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        model.layers[il].ffn_norm_b,
                        LLM_NORM, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   model.layers[il].ffn_up_b,   NULL,
                        NULL,                      NULL,                        NULL,
                        model.layers[il].ffn_down, model.layers[il].ffn_down_b, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = build_norm(inpL,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }